

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_remove<EasyUseHashMap<HashObject<256,32>,int,HashFn>>(int iters)

{
  int in_EDI;
  double ut;
  int i;
  Rusage t;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  key_type *in_stack_fffffffffffffd88;
  HashObject<256,_32> *in_stack_fffffffffffffd90;
  Rusage *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  int local_58;
  
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e1d7b);
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffd90);
  for (local_58 = 0; local_58 < in_EDI; local_58 = local_58 + 1) {
    HashObject<256,_32>::HashObject
              (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    in_stack_fffffffffffffd90 =
         (HashObject<256,_32> *)
         std::
         unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
         ::operator[]((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                       *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    in_stack_fffffffffffffd90->i_ = local_58 + 1;
  }
  Rusage::Reset((Rusage *)in_stack_fffffffffffffd90);
  for (local_58 = 0; local_58 < in_EDI; local_58 = local_58 + 1) {
    HashObject<256,_32>::HashObject
              (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    std::
    unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  Rusage::UserTime(in_stack_fffffffffffffda0);
  report(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
         in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e1ed5);
  return;
}

Assistant:

static void time_map_remove(int iters) {
  MapType set;
  Rusage t;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  t.Reset();
  for (i = 0; i < iters; i++) {
    set.erase(i);
  }
  double ut = t.UserTime();

  report("map_remove", ut, iters, 0, 0);
}